

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.h
# Opt level: O2

ChLoadBodyBodyTorque * __thiscall chrono::ChLoadBodyBodyTorque::Clone(ChLoadBodyBodyTorque *this)

{
  ChLoadBodyBodyTorque *this_00;
  
  this_00 = (ChLoadBodyBodyTorque *)::operator_new(0x3d0);
  ChLoadBodyBodyTorque(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoadBodyBodyTorque* Clone() const override { return new ChLoadBodyBodyTorque(*this); }